

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getarg_tests.cpp
# Opt level: O1

void __thiscall getarg_tests::boolargno::test_method(boolargno *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  long lVar3;
  iterator in_R8;
  iterator pvVar4;
  iterator in_R9;
  iterator pvVar5;
  long *plVar6;
  long in_FS_OFFSET;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  __l;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  ArgsManager local_args;
  check_type cVar7;
  char *local_4f8;
  char *local_4f0;
  undefined1 *local_4e8;
  undefined1 *local_4e0;
  char *local_4d8;
  char *local_4d0;
  char *local_4c8;
  char *local_4c0;
  undefined1 *local_4b8;
  undefined1 *local_4b0;
  char *local_4a8;
  char *local_4a0;
  char *local_498;
  char *local_490;
  undefined1 *local_488;
  undefined1 *local_480;
  char *local_478;
  char *local_470;
  char *local_468;
  char *local_460;
  undefined1 *local_458;
  undefined1 *local_450;
  char *local_448;
  char *local_440;
  char *local_438;
  char *local_430;
  undefined1 *local_428;
  undefined1 *local_420;
  char *local_418;
  char *local_410;
  char *local_408;
  char *local_400;
  undefined1 *local_3f8;
  undefined1 *local_3f0;
  char *local_3e8;
  char *local_3e0;
  char *local_3d8;
  char *local_3d0;
  undefined1 *local_3c8;
  undefined1 *local_3c0;
  char *local_3b8;
  char *local_3b0;
  char *local_3a8;
  char *local_3a0;
  undefined1 *local_398;
  undefined1 *local_390;
  char *local_388;
  char *local_380;
  char *local_378;
  char *local_370;
  undefined1 *local_368;
  undefined1 *local_360;
  char *local_358;
  char *local_350;
  char *local_348;
  char *local_340;
  char *local_338;
  char *local_330;
  undefined1 local_328 [16];
  undefined1 *local_318;
  char **local_310;
  assertion_result local_308;
  undefined1 *local_2f0;
  undefined1 *local_2e8;
  char *local_2e0;
  char *local_2d8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_2d0;
  string local_2a8 [16];
  long local_298 [2];
  undefined4 local_288;
  ArgsManager local_280;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  ArgsManager::ArgsManager(&local_280);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2d0,"-foo",(allocator<char> *)&local_308);
  local_2d0.second = 1;
  std::__cxx11::string::string<std::allocator<char>>(local_2a8,"-bar",(allocator<char> *)&local_308)
  ;
  local_288 = 1;
  __l._M_len = 2;
  __l._M_array = &local_2d0;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
            *)local_328,__l,(allocator_type *)&local_308);
  SetupArgs(&local_280,
            (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             *)local_328);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             *)local_328);
  lVar3 = -0x50;
  plVar6 = local_298;
  do {
    if (plVar6 != (long *)plVar6[-2]) {
      operator_delete((long *)plVar6[-2],*plVar6 + 1);
    }
    plVar6 = plVar6 + -5;
    lVar3 = lVar3 + 0x28;
  } while (lVar3 != 0);
  paVar1 = &local_2d0.first.field_2;
  local_2d0.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"-nofoo","");
  ResetArgs(&local_280,&local_2d0.first);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_2d0.first._M_dataplus._M_p,
                    local_2d0.first.field_2._M_allocated_capacity + 1);
  }
  local_2e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_2d8 = "";
  local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x197;
  file.m_begin = (iterator)&local_2e0;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_2f0,msg);
  local_2d0.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"-foo","");
  bVar2 = ArgsManager::GetBoolArg(&local_280,&local_2d0.first,true);
  local_308.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar2;
  local_308.m_message.px = (element_type *)0x0;
  local_308.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_338 = "!local_args.GetBoolArg(\"-foo\", true)";
  local_330 = "";
  local_328[8] = false;
  local_328._0_8_ = &PTR__lazy_ostream_013abc70;
  local_318 = boost::unit_test::lazy_ostream::inst;
  local_348 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_340 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x0;
  local_310 = &local_338;
  boost::test_tools::tt_detail::report_assertion
            (&local_308,(lazy_ostream *)local_328,1,0,WARN,_cVar7,(size_t)&local_348,0x197);
  boost::detail::shared_count::~shared_count(&local_308.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_2d0.first._M_dataplus._M_p,
                    local_2d0.first.field_2._M_allocated_capacity + 1);
  }
  local_358 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_350 = "";
  local_368 = &boost::unit_test::basic_cstring<char_const>::null;
  local_360 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x198;
  file_00.m_begin = (iterator)&local_358;
  msg_00.m_end = pvVar5;
  msg_00.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_368,
             msg_00);
  local_2d0.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"-foo","");
  bVar2 = ArgsManager::GetBoolArg(&local_280,&local_2d0.first,false);
  local_308.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar2;
  local_308.m_message.px = (element_type *)0x0;
  local_308.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_338 = "!local_args.GetBoolArg(\"-foo\", false)";
  local_330 = "";
  local_328[8] = false;
  local_328._0_8_ = &PTR__lazy_ostream_013abc70;
  local_318 = boost::unit_test::lazy_ostream::inst;
  local_378 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_370 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x0;
  local_310 = &local_338;
  boost::test_tools::tt_detail::report_assertion
            (&local_308,(lazy_ostream *)local_328,1,0,WARN,_cVar7,(size_t)&local_378,0x198);
  boost::detail::shared_count::~shared_count(&local_308.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_2d0.first._M_dataplus._M_p,
                    local_2d0.first.field_2._M_allocated_capacity + 1);
  }
  local_2d0.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"-nofoo=1","");
  ResetArgs(&local_280,&local_2d0.first);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_2d0.first._M_dataplus._M_p,
                    local_2d0.first.field_2._M_allocated_capacity + 1);
  }
  local_388 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_380 = "";
  local_398 = &boost::unit_test::basic_cstring<char_const>::null;
  local_390 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x19b;
  file_01.m_begin = (iterator)&local_388;
  msg_01.m_end = pvVar5;
  msg_01.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_398,
             msg_01);
  local_2d0.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"-foo","");
  bVar2 = ArgsManager::GetBoolArg(&local_280,&local_2d0.first,true);
  local_308.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar2;
  local_308.m_message.px = (element_type *)0x0;
  local_308.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_338 = "!local_args.GetBoolArg(\"-foo\", true)";
  local_330 = "";
  local_328[8] = false;
  local_328._0_8_ = &PTR__lazy_ostream_013abc70;
  local_318 = boost::unit_test::lazy_ostream::inst;
  local_3a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_3a0 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x0;
  local_310 = &local_338;
  boost::test_tools::tt_detail::report_assertion
            (&local_308,(lazy_ostream *)local_328,1,0,WARN,_cVar7,(size_t)&local_3a8,0x19b);
  boost::detail::shared_count::~shared_count(&local_308.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_2d0.first._M_dataplus._M_p,
                    local_2d0.first.field_2._M_allocated_capacity + 1);
  }
  local_3b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_3b0 = "";
  local_3c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x19c;
  file_02.m_begin = (iterator)&local_3b8;
  msg_02.m_end = pvVar5;
  msg_02.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_3c8,
             msg_02);
  local_2d0.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"-foo","");
  bVar2 = ArgsManager::GetBoolArg(&local_280,&local_2d0.first,false);
  local_308.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar2;
  local_308.m_message.px = (element_type *)0x0;
  local_308.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_338 = "!local_args.GetBoolArg(\"-foo\", false)";
  local_330 = "";
  local_328[8] = false;
  local_328._0_8_ = &PTR__lazy_ostream_013abc70;
  local_318 = boost::unit_test::lazy_ostream::inst;
  local_3d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_3d0 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x0;
  local_310 = &local_338;
  boost::test_tools::tt_detail::report_assertion
            (&local_308,(lazy_ostream *)local_328,1,0,WARN,_cVar7,(size_t)&local_3d8,0x19c);
  boost::detail::shared_count::~shared_count(&local_308.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_2d0.first._M_dataplus._M_p,
                    local_2d0.first.field_2._M_allocated_capacity + 1);
  }
  local_2d0.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"-nofoo=0","");
  ResetArgs(&local_280,&local_2d0.first);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_2d0.first._M_dataplus._M_p,
                    local_2d0.first.field_2._M_allocated_capacity + 1);
  }
  local_3e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_3e0 = "";
  local_3f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x19f;
  file_03.m_begin = (iterator)&local_3e8;
  msg_03.m_end = pvVar5;
  msg_03.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_3f8,
             msg_03);
  local_2d0.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"-foo","");
  local_308.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)ArgsManager::GetBoolArg(&local_280,&local_2d0.first,true);
  local_308.m_message.px = (element_type *)0x0;
  local_308.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_338 = "local_args.GetBoolArg(\"-foo\", true)";
  local_330 = "";
  local_328[8] = false;
  local_328._0_8_ = &PTR__lazy_ostream_013abc70;
  local_318 = boost::unit_test::lazy_ostream::inst;
  local_408 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_400 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x0;
  local_310 = &local_338;
  boost::test_tools::tt_detail::report_assertion
            (&local_308,(lazy_ostream *)local_328,1,0,WARN,_cVar7,(size_t)&local_408,0x19f);
  boost::detail::shared_count::~shared_count(&local_308.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_2d0.first._M_dataplus._M_p,
                    local_2d0.first.field_2._M_allocated_capacity + 1);
  }
  local_418 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_410 = "";
  local_428 = &boost::unit_test::basic_cstring<char_const>::null;
  local_420 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x1a0;
  file_04.m_begin = (iterator)&local_418;
  msg_04.m_end = pvVar5;
  msg_04.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_428,
             msg_04);
  local_2d0.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"-foo","");
  local_308.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)ArgsManager::GetBoolArg(&local_280,&local_2d0.first,false);
  local_308.m_message.px = (element_type *)0x0;
  local_308.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_338 = "local_args.GetBoolArg(\"-foo\", false)";
  local_330 = "";
  local_328[8] = false;
  local_328._0_8_ = &PTR__lazy_ostream_013abc70;
  local_318 = boost::unit_test::lazy_ostream::inst;
  local_438 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_430 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x0;
  local_310 = &local_338;
  boost::test_tools::tt_detail::report_assertion
            (&local_308,(lazy_ostream *)local_328,1,0,WARN,_cVar7,(size_t)&local_438,0x1a0);
  boost::detail::shared_count::~shared_count(&local_308.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_2d0.first._M_dataplus._M_p,
                    local_2d0.first.field_2._M_allocated_capacity + 1);
  }
  local_2d0.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"-foo --nofoo","");
  ResetArgs(&local_280,&local_2d0.first);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_2d0.first._M_dataplus._M_p,
                    local_2d0.first.field_2._M_allocated_capacity + 1);
  }
  local_448 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_440 = "";
  local_458 = &boost::unit_test::basic_cstring<char_const>::null;
  local_450 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x1a3;
  file_05.m_begin = (iterator)&local_448;
  msg_05.m_end = pvVar5;
  msg_05.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_458,
             msg_05);
  local_2d0.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"-foo","");
  bVar2 = ArgsManager::GetBoolArg(&local_280,&local_2d0.first,true);
  local_308.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar2;
  local_308.m_message.px = (element_type *)0x0;
  local_308.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_338 = "!local_args.GetBoolArg(\"-foo\", true)";
  local_330 = "";
  local_328[8] = false;
  local_328._0_8_ = &PTR__lazy_ostream_013abc70;
  local_318 = boost::unit_test::lazy_ostream::inst;
  local_468 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_460 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x0;
  local_310 = &local_338;
  boost::test_tools::tt_detail::report_assertion
            (&local_308,(lazy_ostream *)local_328,1,0,WARN,_cVar7,(size_t)&local_468,0x1a3);
  boost::detail::shared_count::~shared_count(&local_308.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_2d0.first._M_dataplus._M_p,
                    local_2d0.first.field_2._M_allocated_capacity + 1);
  }
  local_478 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_470 = "";
  local_488 = &boost::unit_test::basic_cstring<char_const>::null;
  local_480 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x1a4;
  file_06.m_begin = (iterator)&local_478;
  msg_06.m_end = pvVar5;
  msg_06.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_488,
             msg_06);
  local_2d0.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"-foo","");
  bVar2 = ArgsManager::GetBoolArg(&local_280,&local_2d0.first,false);
  local_308.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar2;
  local_308.m_message.px = (element_type *)0x0;
  local_308.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_338 = "!local_args.GetBoolArg(\"-foo\", false)";
  local_330 = "";
  local_328[8] = false;
  local_328._0_8_ = &PTR__lazy_ostream_013abc70;
  local_318 = boost::unit_test::lazy_ostream::inst;
  local_498 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_490 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x0;
  local_310 = &local_338;
  boost::test_tools::tt_detail::report_assertion
            (&local_308,(lazy_ostream *)local_328,1,0,WARN,_cVar7,(size_t)&local_498,0x1a4);
  boost::detail::shared_count::~shared_count(&local_308.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_2d0.first._M_dataplus._M_p,
                    local_2d0.first.field_2._M_allocated_capacity + 1);
  }
  local_2d0.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"-nofoo -foo","");
  ResetArgs(&local_280,&local_2d0.first);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_2d0.first._M_dataplus._M_p,
                    local_2d0.first.field_2._M_allocated_capacity + 1);
  }
  local_4a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_4a0 = "";
  local_4b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x1a7;
  file_07.m_begin = (iterator)&local_4a8;
  msg_07.m_end = pvVar5;
  msg_07.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_4b8,
             msg_07);
  local_2d0.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"-foo","");
  local_308.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)ArgsManager::GetBoolArg(&local_280,&local_2d0.first,true);
  local_308.m_message.px = (element_type *)0x0;
  local_308.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_338 = "local_args.GetBoolArg(\"-foo\", true)";
  local_330 = "";
  local_328[8] = false;
  local_328._0_8_ = &PTR__lazy_ostream_013abc70;
  local_318 = boost::unit_test::lazy_ostream::inst;
  local_4c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_4c0 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x0;
  local_310 = &local_338;
  boost::test_tools::tt_detail::report_assertion
            (&local_308,(lazy_ostream *)local_328,1,0,WARN,_cVar7,(size_t)&local_4c8,0x1a7);
  boost::detail::shared_count::~shared_count(&local_308.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_2d0.first._M_dataplus._M_p,
                    local_2d0.first.field_2._M_allocated_capacity + 1);
  }
  local_4d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_4d0 = "";
  local_4e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x1a8;
  file_08.m_begin = (iterator)&local_4d8;
  msg_08.m_end = pvVar5;
  msg_08.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_4e8,
             msg_08);
  local_2d0.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"-foo","");
  local_308.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)ArgsManager::GetBoolArg(&local_280,&local_2d0.first,false);
  local_308.m_message.px = (element_type *)0x0;
  local_308.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_338 = "local_args.GetBoolArg(\"-foo\", false)";
  local_330 = "";
  local_328[8] = false;
  local_328._0_8_ = &PTR__lazy_ostream_013abc70;
  local_318 = boost::unit_test::lazy_ostream::inst;
  local_4f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_4f0 = "";
  local_310 = &local_338;
  boost::test_tools::tt_detail::report_assertion
            (&local_308,(lazy_ostream *)local_328,1,0,WARN,_cVar7,(size_t)&local_4f8,0x1a8);
  boost::detail::shared_count::~shared_count(&local_308.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_2d0.first._M_dataplus._M_p,
                    local_2d0.first.field_2._M_allocated_capacity + 1);
  }
  ArgsManager::~ArgsManager(&local_280);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(boolargno)
{
    ArgsManager local_args;

    const auto foo = std::make_pair("-foo", ArgsManager::ALLOW_ANY);
    const auto bar = std::make_pair("-bar", ArgsManager::ALLOW_ANY);
    SetupArgs(local_args, {foo, bar});
    ResetArgs(local_args, "-nofoo");
    BOOST_CHECK(!local_args.GetBoolArg("-foo", true));
    BOOST_CHECK(!local_args.GetBoolArg("-foo", false));

    ResetArgs(local_args, "-nofoo=1");
    BOOST_CHECK(!local_args.GetBoolArg("-foo", true));
    BOOST_CHECK(!local_args.GetBoolArg("-foo", false));

    ResetArgs(local_args, "-nofoo=0");
    BOOST_CHECK(local_args.GetBoolArg("-foo", true));
    BOOST_CHECK(local_args.GetBoolArg("-foo", false));

    ResetArgs(local_args, "-foo --nofoo"); // --nofoo should win
    BOOST_CHECK(!local_args.GetBoolArg("-foo", true));
    BOOST_CHECK(!local_args.GetBoolArg("-foo", false));

    ResetArgs(local_args, "-nofoo -foo"); // foo always wins:
    BOOST_CHECK(local_args.GetBoolArg("-foo", true));
    BOOST_CHECK(local_args.GetBoolArg("-foo", false));
}